

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

void secp256k1_nonce_function_musig
               (secp256k1_scalar *k,uchar *session_secrand,uchar *msg32,uchar *seckey32,uchar *pk33,
               uchar *agg_pk32,uchar *extra_input32)

{
  long lVar1;
  long lVar2;
  secp256k1_sha256 *psVar3;
  secp256k1_sha256 *psVar4;
  byte bVar5;
  uchar local_152;
  uchar msg_present;
  uchar *local_150;
  uchar rand [32];
  uchar buf [32];
  secp256k1_sha256 sha_tmp;
  secp256k1_sha256 sha;
  
  bVar5 = 0;
  local_150 = agg_pk32;
  if (seckey32 == (uchar *)0x0) {
    rand._0_8_ = *(undefined8 *)session_secrand;
    rand._8_8_ = *(undefined8 *)(session_secrand + 8);
    rand._16_8_ = *(undefined8 *)(session_secrand + 0x10);
    rand._24_8_ = *(undefined8 *)(session_secrand + 0x18);
  }
  else {
    secp256k1_nonce_function_musig_sha256_tagged_aux(&sha);
    secp256k1_sha256_write(&sha,session_secrand,0x20);
    secp256k1_sha256_finalize(&sha,rand);
    for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
      rand[lVar1] = rand[lVar1] ^ seckey32[lVar1];
    }
    local_152 = ' ';
  }
  secp256k1_nonce_function_musig_sha256_tagged(&sha);
  secp256k1_sha256_write(&sha,rand,0x20);
  secp256k1_nonce_function_musig_helper(&sha,1,pk33,'!');
  secp256k1_nonce_function_musig_helper(&sha,1,local_150,' ');
  msg_present = msg32 != (uchar *)0x0;
  secp256k1_sha256_write(&sha,&msg_present,1);
  if (msg32 != (uchar *)0x0) {
    secp256k1_nonce_function_musig_helper(&sha,8,msg32,' ');
  }
  secp256k1_nonce_function_musig_helper(&sha,4,extra_input32,' ');
  for (lVar1 = 0; local_152 = (uchar)lVar1, lVar1 != 2; lVar1 = lVar1 + 1) {
    psVar3 = &sha;
    psVar4 = &sha_tmp;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)psVar4->s = *(undefined8 *)psVar3->s;
      psVar3 = (secp256k1_sha256 *)((long)psVar3 + (ulong)bVar5 * -0x10 + 8);
      psVar4 = (secp256k1_sha256 *)((long)psVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    secp256k1_sha256_write(&sha_tmp,&local_152,1);
    secp256k1_sha256_finalize(&sha_tmp,buf);
    secp256k1_scalar_set_b32(k,buf,(int *)0x0);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    sha_tmp.buf[0x30] = '\0';
    sha_tmp.buf[0x31] = '\0';
    sha_tmp.buf[0x32] = '\0';
    sha_tmp.buf[0x33] = '\0';
    sha_tmp.buf[0x34] = '\0';
    sha_tmp.buf[0x35] = '\0';
    sha_tmp.buf[0x36] = '\0';
    sha_tmp.buf[0x37] = '\0';
    sha_tmp.buf[0x38] = '\0';
    sha_tmp.buf[0x39] = '\0';
    sha_tmp.buf[0x3a] = '\0';
    sha_tmp.buf[0x3b] = '\0';
    sha_tmp.buf[0x3c] = '\0';
    sha_tmp.buf[0x3d] = '\0';
    sha_tmp.buf[0x3e] = '\0';
    sha_tmp.buf[0x3f] = '\0';
    sha_tmp.buf[0x20] = '\0';
    sha_tmp.buf[0x21] = '\0';
    sha_tmp.buf[0x22] = '\0';
    sha_tmp.buf[0x23] = '\0';
    sha_tmp.buf[0x24] = '\0';
    sha_tmp.buf[0x25] = '\0';
    sha_tmp.buf[0x26] = '\0';
    sha_tmp.buf[0x27] = '\0';
    sha_tmp.buf[0x28] = '\0';
    sha_tmp.buf[0x29] = '\0';
    sha_tmp.buf[0x2a] = '\0';
    sha_tmp.buf[0x2b] = '\0';
    sha_tmp.buf[0x2c] = '\0';
    sha_tmp.buf[0x2d] = '\0';
    sha_tmp.buf[0x2e] = '\0';
    sha_tmp.buf[0x2f] = '\0';
    sha_tmp.buf[0x10] = '\0';
    sha_tmp.buf[0x11] = '\0';
    sha_tmp.buf[0x12] = '\0';
    sha_tmp.buf[0x13] = '\0';
    sha_tmp.buf[0x14] = '\0';
    sha_tmp.buf[0x15] = '\0';
    sha_tmp.buf[0x16] = '\0';
    sha_tmp.buf[0x17] = '\0';
    sha_tmp.buf[0x18] = '\0';
    sha_tmp.buf[0x19] = '\0';
    sha_tmp.buf[0x1a] = '\0';
    sha_tmp.buf[0x1b] = '\0';
    sha_tmp.buf[0x1c] = '\0';
    sha_tmp.buf[0x1d] = '\0';
    sha_tmp.buf[0x1e] = '\0';
    sha_tmp.buf[0x1f] = '\0';
    sha_tmp.buf[0] = '\0';
    sha_tmp.buf[1] = '\0';
    sha_tmp.buf[2] = '\0';
    sha_tmp.buf[3] = '\0';
    sha_tmp.buf[4] = '\0';
    sha_tmp.buf[5] = '\0';
    sha_tmp.buf[6] = '\0';
    sha_tmp.buf[7] = '\0';
    sha_tmp.buf[8] = '\0';
    sha_tmp.buf[9] = '\0';
    sha_tmp.buf[10] = '\0';
    sha_tmp.buf[0xb] = '\0';
    sha_tmp.buf[0xc] = '\0';
    sha_tmp.buf[0xd] = '\0';
    sha_tmp.buf[0xe] = '\0';
    sha_tmp.buf[0xf] = '\0';
    sha_tmp.s[4] = 0;
    sha_tmp.s[5] = 0;
    sha_tmp.s[6] = 0;
    sha_tmp.s[7] = 0;
    sha_tmp.bytes = 0;
    sha_tmp.s[0] = 0;
    sha_tmp.s[1] = 0;
    sha_tmp.s[2] = 0;
    sha_tmp.s[3] = 0;
    k = k + 1;
  }
  return;
}

Assistant:

static void secp256k1_nonce_function_musig(secp256k1_scalar *k, const unsigned char *session_secrand, const unsigned char *msg32, const unsigned char *seckey32, const unsigned char *pk33, const unsigned char *agg_pk32, const unsigned char *extra_input32) {
    secp256k1_sha256 sha;
    unsigned char rand[32];
    unsigned char i;
    unsigned char msg_present;

    if (seckey32 != NULL) {
        secp256k1_nonce_function_musig_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, session_secrand, 32);
        secp256k1_sha256_finalize(&sha, rand);
        for (i = 0; i < 32; i++) {
            rand[i] ^= seckey32[i];
        }
    } else {
        memcpy(rand, session_secrand, sizeof(rand));
    }

    secp256k1_nonce_function_musig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, rand, sizeof(rand));
    secp256k1_nonce_function_musig_helper(&sha, 1, pk33, 33);
    secp256k1_nonce_function_musig_helper(&sha, 1, agg_pk32, 32);
    msg_present = msg32 != NULL;
    secp256k1_sha256_write(&sha, &msg_present, 1);
    if (msg_present) {
        secp256k1_nonce_function_musig_helper(&sha, 8, msg32, 32);
    }
    secp256k1_nonce_function_musig_helper(&sha, 4, extra_input32, 32);

    for (i = 0; i < 2; i++) {
        unsigned char buf[32];
        secp256k1_sha256 sha_tmp = sha;
        secp256k1_sha256_write(&sha_tmp, &i, 1);
        secp256k1_sha256_finalize(&sha_tmp, buf);
        secp256k1_scalar_set_b32(&k[i], buf, NULL);

        /* Attempt to erase secret data */
        secp256k1_memclear(buf, sizeof(buf));
        secp256k1_sha256_clear(&sha_tmp);
    }
    secp256k1_memclear(rand, sizeof(rand));
    secp256k1_sha256_clear(&sha);
}